

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaQNameRefPtr
xmlSchemaNewQNameRef
          (xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypeType refType,xmlChar *refName,xmlChar *refNs)

{
  xmlSchemaQNameRefPtr item;
  
  item = (xmlSchemaQNameRefPtr)(*xmlMalloc)(0x30);
  if (item == (xmlSchemaQNameRefPtr)0x0) {
    if (pctxt != (xmlSchemaParserCtxtPtr)0x0) {
      pctxt->nberrors = pctxt->nberrors + 1;
    }
    __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating QName reference item");
  }
  else {
    item->node = (xmlNodePtr)0x0;
    item->type = XML_SCHEMA_EXTRA_QNAMEREF;
    item->name = refName;
    item->targetNamespace = refNs;
    item->item = (xmlSchemaBasicItemPtr)0x0;
    item->itemType = refType;
    xmlSchemaAddItemSize(&pctxt->constructor->bucket->locals,10,item);
  }
  return item;
}

Assistant:

static xmlSchemaQNameRefPtr
xmlSchemaNewQNameRef(xmlSchemaParserCtxtPtr pctxt,
		     xmlSchemaTypeType refType,
		     const xmlChar *refName,
		     const xmlChar *refNs)
{
    xmlSchemaQNameRefPtr ret;

    ret = (xmlSchemaQNameRefPtr)
	xmlMalloc(sizeof(xmlSchemaQNameRef));
    if (ret == NULL) {
	xmlSchemaPErrMemory(pctxt,
	    "allocating QName reference item", NULL);
	return (NULL);
    }
    ret->node = NULL;
    ret->type = XML_SCHEMA_EXTRA_QNAMEREF;
    ret->name = refName;
    ret->targetNamespace = refNs;
    ret->item = NULL;
    ret->itemType = refType;
    /*
    * Store the reference item in the schema.
    */
    WXS_ADD_LOCAL(pctxt, ret);
    return (ret);
}